

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O1

REF_STATUS
ref_clump_between_export_to(REF_GRID_conflict ref_grid,REF_INT node0,REF_INT node1,char *filename)

{
  REF_CELL pRVar1;
  REF_ADJ_ITEM pRVar2;
  REF_NODE ref_node;
  REF_NODE pRVar3;
  REF_DBL *pRVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  int iVar7;
  undefined8 uVar8;
  long lVar9;
  uint *puVar10;
  long lVar11;
  REF_INT RVar12;
  char *pcVar13;
  ulong uVar14;
  int iVar15;
  REF_INT new_cell;
  REF_DICT node_dict;
  REF_GRID_conflict loc_grid;
  REF_INT new_node;
  REF_INT nodes [27];
  uint local_ec;
  int local_e4;
  REF_DICT local_e0;
  uint local_d4;
  REF_GRID_conflict local_d0;
  REF_GRID local_c8;
  REF_CELL local_c0;
  int local_b4;
  char *local_b0;
  uint local_a8 [30];
  
  uVar6 = ref_grid_create(&local_c8,ref_grid->mpi);
  if (uVar6 == 0) {
    uVar6 = ref_dict_create(&local_e0);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x10f
             ,"ref_clump_between_export_to",(ulong)uVar6,"create nodes");
      return uVar6;
    }
    pRVar1 = ref_grid->cell[3];
    uVar14 = 0xffffffff;
    if (-1 < node0) {
      uVar14 = 0xffffffff;
      if (node0 < pRVar1->ref_adj->nnode) {
        uVar14 = (ulong)(uint)pRVar1->ref_adj->first[(uint)node0];
      }
    }
    local_d4 = node1;
    local_d0 = ref_grid;
    local_b0 = filename;
    if ((int)uVar14 != -1) {
      RVar12 = pRVar1->ref_adj->item[(int)uVar14].ref;
      do {
        uVar6 = ref_cell_nodes(pRVar1,RVar12,(REF_INT *)local_a8);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x113,"ref_clump_between_export_to",(ulong)uVar6,"n");
          return uVar6;
        }
        if (0 < pRVar1->node_per) {
          lVar11 = 0;
          do {
            uVar6 = ref_dict_store(local_e0,local_a8[lVar11],0);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x115,"ref_clump_between_export_to",(ulong)uVar6,"store");
              return uVar6;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < pRVar1->node_per);
        }
        pRVar2 = pRVar1->ref_adj->item;
        iVar15 = pRVar2[(int)uVar14].next;
        uVar14 = (ulong)iVar15;
        if (uVar14 == 0xffffffffffffffff) {
          RVar12 = -1;
        }
        else {
          RVar12 = pRVar2[uVar14].ref;
        }
      } while (iVar15 != -1);
    }
    uVar14 = 0xffffffff;
    if (-1 < (int)local_d4) {
      uVar14 = 0xffffffff;
      if ((int)local_d4 < pRVar1->ref_adj->nnode) {
        uVar14 = (ulong)(uint)pRVar1->ref_adj->first[local_d4];
      }
    }
    if ((int)uVar14 != -1) {
      RVar12 = pRVar1->ref_adj->item[(int)uVar14].ref;
      do {
        uVar6 = ref_cell_nodes(pRVar1,RVar12,(REF_INT *)local_a8);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x118,"ref_clump_between_export_to",(ulong)uVar6,"n");
          return uVar6;
        }
        if (0 < pRVar1->node_per) {
          lVar11 = 0;
          do {
            uVar6 = ref_dict_store(local_e0,local_a8[lVar11],0);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x11a,"ref_clump_between_export_to",(ulong)uVar6,"store");
              return uVar6;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < pRVar1->node_per);
        }
        pRVar2 = pRVar1->ref_adj->item;
        iVar15 = pRVar2[(int)uVar14].next;
        uVar14 = (ulong)iVar15;
        if (uVar14 == 0xffffffffffffffff) {
          RVar12 = -1;
        }
        else {
          RVar12 = pRVar2[uVar14].ref;
        }
      } while (iVar15 != -1);
    }
    pRVar1 = local_d0->cell[8];
    uVar14 = 0xffffffff;
    if (-1 < node0) {
      uVar14 = 0xffffffff;
      if (node0 < pRVar1->ref_adj->nnode) {
        uVar14 = (ulong)(uint)pRVar1->ref_adj->first[(uint)node0];
      }
    }
    if ((int)uVar14 != -1) {
      RVar12 = pRVar1->ref_adj->item[(int)uVar14].ref;
      do {
        uVar6 = ref_cell_nodes(pRVar1,RVar12,(REF_INT *)local_a8);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x11f,"ref_clump_between_export_to",(ulong)uVar6,"n");
          return uVar6;
        }
        if (0 < pRVar1->node_per) {
          lVar11 = 0;
          do {
            uVar6 = ref_dict_store(local_e0,local_a8[lVar11],0);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x121,"ref_clump_between_export_to",(ulong)uVar6,"store");
              return uVar6;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < pRVar1->node_per);
        }
        pRVar2 = pRVar1->ref_adj->item;
        iVar15 = pRVar2[(int)uVar14].next;
        uVar14 = (ulong)iVar15;
        if (uVar14 == 0xffffffffffffffff) {
          RVar12 = -1;
        }
        else {
          RVar12 = pRVar2[uVar14].ref;
        }
      } while (iVar15 != -1);
    }
    uVar14 = 0xffffffff;
    if (-1 < (int)local_d4) {
      uVar14 = 0xffffffff;
      if ((int)local_d4 < pRVar1->ref_adj->nnode) {
        uVar14 = (ulong)(uint)pRVar1->ref_adj->first[local_d4];
      }
    }
    if ((int)uVar14 != -1) {
      RVar12 = pRVar1->ref_adj->item[(int)uVar14].ref;
      do {
        uVar6 = ref_cell_nodes(pRVar1,RVar12,(REF_INT *)local_a8);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x124,"ref_clump_between_export_to",(ulong)uVar6,"n");
          return uVar6;
        }
        if (0 < pRVar1->node_per) {
          lVar11 = 0;
          do {
            uVar6 = ref_dict_store(local_e0,local_a8[lVar11],0);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x126,"ref_clump_between_export_to",(ulong)uVar6,"store");
              return uVar6;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < pRVar1->node_per);
        }
        pRVar2 = pRVar1->ref_adj->item;
        iVar15 = pRVar2[(int)uVar14].next;
        uVar14 = (ulong)iVar15;
        if (uVar14 == 0xffffffffffffffff) {
          RVar12 = -1;
        }
        else {
          RVar12 = pRVar2[uVar14].ref;
        }
      } while (iVar15 != -1);
    }
    if (local_e0->n < 1) {
      iVar15 = -1;
    }
    else {
      iVar15 = *local_e0->key;
    }
    ref_node = local_c8->node;
    iVar7 = local_e0->n;
    if (0 < iVar7) {
      pRVar3 = local_d0->node;
      lVar11 = 0;
      do {
        uVar6 = ref_node_add(ref_node,lVar11,&local_b4);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 300,"ref_clump_between_export_to",(ulong)uVar6,"new_node");
          return uVar6;
        }
        pRVar4 = pRVar3->real;
        pRVar5 = ref_node->real;
        lVar9 = 0;
        do {
          pRVar5[(long)local_b4 * 0xf + lVar9] = pRVar4[iVar15 * 0xf + lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        lVar11 = lVar11 + 1;
        iVar15 = -1;
        if (lVar11 < local_e0->n) {
          iVar15 = local_e0->key[lVar11];
        }
        iVar7 = local_e0->n;
      } while (lVar11 < iVar7);
    }
    uVar6 = ref_node_initialize_n_global(ref_node,(long)iVar7);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x133
             ,"ref_clump_between_export_to",(ulong)uVar6,"init glob");
      return uVar6;
    }
    pRVar1 = local_d0->cell[8];
    RVar12 = -1;
    uVar14 = 0xffffffff;
    if (-1 < node0) {
      uVar14 = 0xffffffff;
      if (node0 < pRVar1->ref_adj->nnode) {
        uVar14 = (ulong)(uint)pRVar1->ref_adj->first[(uint)node0];
      }
    }
    iVar15 = (int)uVar14;
    if (iVar15 != -1) {
      RVar12 = pRVar1->ref_adj->item[iVar15].ref;
    }
    local_c0 = local_c8->cell[8];
    local_ec = 0;
    if (iVar15 != -1) {
      do {
        uVar6 = ref_cell_nodes(pRVar1,RVar12,(REF_INT *)local_a8);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x138,"ref_clump_between_export_to",(ulong)uVar6,"n");
          return uVar6;
        }
        if (0 < pRVar1->node_per) {
          lVar11 = 0;
          puVar10 = local_a8;
          do {
            uVar6 = ref_dict_location(local_e0,*puVar10,(REF_INT *)puVar10);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x13b,"ref_clump_between_export_to",(ulong)uVar6,"map");
              return uVar6;
            }
            lVar11 = lVar11 + 1;
            puVar10 = puVar10 + 1;
          } while (lVar11 < pRVar1->node_per);
        }
        uVar6 = ref_cell_with(local_c0,(REF_INT *)local_a8,&local_e4);
        if ((uVar6 != 0) && (uVar6 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x13d,"ref_clump_between_export_to",(ulong)uVar6,"exists?");
          local_ec = uVar6;
        }
        if ((uVar6 != 5) && (uVar6 != 0)) {
          return local_ec;
        }
        if ((local_e4 == -1) &&
           (uVar6 = ref_cell_add(local_c0,(REF_INT *)local_a8,&local_e4), uVar6 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x13f,"ref_clump_between_export_to",(ulong)uVar6,"new cell");
          return uVar6;
        }
        pRVar2 = pRVar1->ref_adj->item;
        iVar15 = pRVar2[(int)uVar14].next;
        uVar14 = (ulong)iVar15;
        if (uVar14 == 0xffffffffffffffff) {
          RVar12 = -1;
        }
        else {
          RVar12 = pRVar2[uVar14].ref;
        }
      } while (iVar15 != -1);
    }
    uVar14 = 0xffffffff;
    if (-1 < (int)local_d4) {
      uVar14 = 0xffffffff;
      if ((int)local_d4 < pRVar1->ref_adj->nnode) {
        uVar14 = (ulong)(uint)pRVar1->ref_adj->first[local_d4];
      }
    }
    if ((int)uVar14 != -1) {
      RVar12 = pRVar1->ref_adj->item[(int)uVar14].ref;
      do {
        uVar6 = ref_cell_nodes(pRVar1,RVar12,(REF_INT *)local_a8);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x143,"ref_clump_between_export_to",(ulong)uVar6,"n");
          return uVar6;
        }
        if (0 < pRVar1->node_per) {
          lVar11 = 0;
          puVar10 = local_a8;
          do {
            uVar6 = ref_dict_location(local_e0,*puVar10,(REF_INT *)puVar10);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x146,"ref_clump_between_export_to",(ulong)uVar6,"map");
              return uVar6;
            }
            lVar11 = lVar11 + 1;
            puVar10 = puVar10 + 1;
          } while (lVar11 < pRVar1->node_per);
        }
        uVar6 = ref_cell_with(local_c0,(REF_INT *)local_a8,&local_e4);
        if ((uVar6 != 0) && (uVar6 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x148,"ref_clump_between_export_to",(ulong)uVar6,"exists?");
          local_ec = uVar6;
        }
        if ((uVar6 != 5) && (uVar6 != 0)) {
          return local_ec;
        }
        if ((local_e4 == -1) &&
           (uVar6 = ref_cell_add(local_c0,(REF_INT *)local_a8,&local_e4), uVar6 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x14a,"ref_clump_between_export_to",(ulong)uVar6,"new cell");
          return uVar6;
        }
        pRVar2 = pRVar1->ref_adj->item;
        iVar15 = pRVar2[(int)uVar14].next;
        uVar14 = (ulong)iVar15;
        if (uVar14 == 0xffffffffffffffff) {
          RVar12 = -1;
        }
        else {
          RVar12 = pRVar2[uVar14].ref;
        }
      } while (iVar15 != -1);
    }
    pRVar1 = local_d0->cell[3];
    RVar12 = -1;
    uVar14 = 0xffffffff;
    if (-1 < node0) {
      uVar14 = 0xffffffff;
      if (node0 < pRVar1->ref_adj->nnode) {
        uVar14 = (ulong)(uint)pRVar1->ref_adj->first[(uint)node0];
      }
    }
    iVar15 = (int)uVar14;
    if (iVar15 != -1) {
      RVar12 = pRVar1->ref_adj->item[iVar15].ref;
    }
    local_d0 = (REF_GRID_conflict)local_c8->cell[3];
    if (iVar15 != -1) {
      do {
        uVar6 = ref_cell_nodes(pRVar1,RVar12,(REF_INT *)local_a8);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x151,"ref_clump_between_export_to",(ulong)uVar6,"n");
          return uVar6;
        }
        if (0 < pRVar1->node_per) {
          lVar11 = 0;
          puVar10 = local_a8;
          do {
            uVar6 = ref_dict_location(local_e0,*puVar10,(REF_INT *)puVar10);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x154,"ref_clump_between_export_to",(ulong)uVar6,"map");
              return uVar6;
            }
            lVar11 = lVar11 + 1;
            puVar10 = puVar10 + 1;
          } while (lVar11 < pRVar1->node_per);
        }
        uVar6 = ref_cell_with((REF_CELL)local_d0,(REF_INT *)local_a8,&local_e4);
        if ((uVar6 != 0) && (uVar6 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x156,"ref_clump_between_export_to",(ulong)uVar6,"exists?");
          local_ec = uVar6;
        }
        if ((uVar6 != 5) && (uVar6 != 0)) {
          return local_ec;
        }
        if ((local_e4 == -1) &&
           (uVar6 = ref_cell_add((REF_CELL)local_d0,(REF_INT *)local_a8,&local_e4), uVar6 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x158,"ref_clump_between_export_to",(ulong)uVar6,"new cell");
          return uVar6;
        }
        pRVar2 = pRVar1->ref_adj->item;
        iVar15 = pRVar2[(int)uVar14].next;
        uVar14 = (ulong)iVar15;
        if (uVar14 == 0xffffffffffffffff) {
          RVar12 = -1;
        }
        else {
          RVar12 = pRVar2[uVar14].ref;
        }
      } while (iVar15 != -1);
    }
    uVar14 = 0xffffffff;
    if (-1 < (int)local_d4) {
      uVar14 = 0xffffffff;
      if ((int)local_d4 < pRVar1->ref_adj->nnode) {
        uVar14 = (ulong)(uint)pRVar1->ref_adj->first[local_d4];
      }
    }
    if ((int)uVar14 != -1) {
      RVar12 = pRVar1->ref_adj->item[(int)uVar14].ref;
      do {
        uVar6 = ref_cell_nodes(pRVar1,RVar12,(REF_INT *)local_a8);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x15c,"ref_clump_between_export_to",(ulong)uVar6,"n");
          return uVar6;
        }
        if (0 < pRVar1->node_per) {
          puVar10 = local_a8;
          lVar11 = 0;
          do {
            uVar6 = ref_dict_location(local_e0,*puVar10,(REF_INT *)puVar10);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x15f,"ref_clump_between_export_to",(ulong)uVar6,"map");
              return uVar6;
            }
            lVar11 = lVar11 + 1;
            puVar10 = puVar10 + 1;
          } while (lVar11 < pRVar1->node_per);
        }
        uVar6 = ref_cell_with((REF_CELL)local_d0,(REF_INT *)local_a8,&local_e4);
        if ((uVar6 != 0) && (uVar6 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x161,"ref_clump_between_export_to",(ulong)uVar6,"exists?");
          local_ec = uVar6;
        }
        if ((uVar6 != 5) && (uVar6 != 0)) {
          return local_ec;
        }
        if ((local_e4 == -1) &&
           (uVar6 = ref_cell_add((REF_CELL)local_d0,(REF_INT *)local_a8,&local_e4), uVar6 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x163,"ref_clump_between_export_to",(ulong)uVar6,"new cell");
          return uVar6;
        }
        pRVar2 = pRVar1->ref_adj->item;
        iVar15 = pRVar2[(int)uVar14].next;
        uVar14 = (ulong)iVar15;
        if (uVar14 == 0xffffffffffffffff) {
          RVar12 = -1;
        }
        else {
          RVar12 = pRVar2[uVar14].ref;
        }
      } while (iVar15 != -1);
    }
    uVar6 = ref_dict_location(local_e0,node0,(REF_INT *)local_a8);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x167
             ,"ref_clump_between_export_to",(ulong)uVar6,"map0");
      return uVar6;
    }
    uVar6 = ref_dict_location(local_e0,local_d4,(REF_INT *)(local_a8 + 1));
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x168
             ,"ref_clump_between_export_to",(ulong)uVar6,"map1");
      return uVar6;
    }
    printf("node0 %d node1 %d\n",(ulong)local_a8[0],(ulong)local_a8[1]);
    uVar6 = ref_dict_free(local_e0);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x16b
             ,"ref_clump_between_export_to",(ulong)uVar6,"free nodes");
      return uVar6;
    }
    uVar6 = ref_export_by_extension(local_c8,local_b0);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x16d
             ,"ref_clump_between_export_to",(ulong)uVar6,"dump");
      return uVar6;
    }
    uVar6 = ref_grid_free(local_c8);
    if (uVar6 == 0) {
      return 0;
    }
    pcVar13 = "free loc grid";
    uVar8 = 0x16f;
  }
  else {
    pcVar13 = "create grid";
    uVar8 = 0x10d;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar8,
         "ref_clump_between_export_to",(ulong)uVar6,pcVar13);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_clump_between_export_to(REF_GRID ref_grid, REF_INT node0,
                                               REF_INT node1,
                                               const char *filename) {
  REF_GRID loc_grid;
  REF_NODE ref_node, loc_node;
  REF_CELL ref_cell, loc_cell;
  REF_INT item, cell, cell_node;
  REF_INT old, index, new_cell, new_node, ixyz;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DICT node_dict;

  RSS(ref_grid_create(&loc_grid, ref_grid_mpi(ref_grid)), "create grid");

  RSS(ref_dict_create(&node_dict), "create nodes");

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  ref_node = ref_grid_node(ref_grid);
  loc_node = ref_grid_node(loc_grid);
  each_ref_dict_key(node_dict, index, old) {
    RSS(ref_node_add(loc_node, index, &new_node), "new_node");
    for (ixyz = 0; ixyz < 3; ixyz++) {
      ref_node_xyz(loc_node, ixyz, new_node) =
          ref_node_xyz(ref_node, ixyz, old);
    }
  }
  RSS(ref_node_initialize_n_global(loc_node, ref_dict_n(node_dict)),
      "init glob");

  ref_cell = ref_grid_tet(ref_grid);
  loc_cell = ref_grid_tet(loc_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  loc_cell = ref_grid_tri(loc_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }

  RSS(ref_dict_location(node_dict, node0, &(nodes[0])), "map0");
  RSS(ref_dict_location(node_dict, node1, &(nodes[1])), "map1");
  printf("node0 %d node1 %d\n", nodes[0], nodes[1]);

  RSS(ref_dict_free(node_dict), "free nodes");

  RSS(ref_export_by_extension(loc_grid, filename), "dump");

  RSS(ref_grid_free(loc_grid), "free loc grid");

  return REF_SUCCESS;
}